

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsNodeQueue.cpp
# Opt level: O2

void __thiscall HighsNodeQueue::link_domchgs(HighsNodeQueue *this,int64_t node)

{
  pointer pOVar1;
  int iVar2;
  long lVar3;
  NodeSetArray *pNVar4;
  ulong uVar5;
  ulong uVar6;
  pair<std::_Rb_tree_iterator<std::pair<double,_long>_>,_bool> pVar7;
  double val;
  int64_t local_48;
  NodeSetArray *local_40;
  double local_38;
  
  pOVar1 = (this->nodes).
           super__Vector_base<HighsNodeQueue::OpenNode,_std::allocator<HighsNodeQueue::OpenNode>_>.
           _M_impl.super__Vector_impl_data._M_start + node;
  uVar5 = (long)*(pointer *)
                 ((long)&(pOVar1->domchgstack).
                         super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>.
                         _M_impl + 8) -
          *(long *)&(pOVar1->domchgstack).
                    super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>.
                    _M_impl;
  local_48 = node;
  std::
  vector<std::_Rb_tree_const_iterator<std::pair<double,_long>_>,_std::allocator<std::_Rb_tree_const_iterator<std::pair<double,_long>_>_>_>
  ::resize(&pOVar1->domchglinks,(long)(int)(uVar5 >> 4));
  local_40 = &this->colUpperNodesPtr;
  for (uVar6 = 0; (uVar5 >> 1 & 0x7fffffff8) != uVar6; uVar6 = uVar6 + 8) {
    lVar3 = *(long *)&(this->nodes).
                      super__Vector_base<HighsNodeQueue::OpenNode,_std::allocator<HighsNodeQueue::OpenNode>_>
                      ._M_impl.super__Vector_impl_data._M_start[node].domchgstack.
                      super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>.
                      _M_impl;
    local_38 = *(double *)(lVar3 + uVar6 * 2);
    iVar2 = *(int *)(lVar3 + 0xc + uVar6 * 2);
    pNVar4 = &this->colLowerNodesPtr;
    if ((iVar2 == 0) || (pNVar4 = local_40, iVar2 == 1)) {
      pVar7 = std::
              _Rb_tree<std::pair<double,long>,std::pair<double,long>,std::_Identity<std::pair<double,long>>,std::less<std::pair<double,long>>,HighsNodeQueue::NodesetAllocator<std::pair<double,long>>>
              ::_M_emplace_unique<double&,long&>
                        ((_Rb_tree<std::pair<double,long>,std::pair<double,long>,std::_Identity<std::pair<double,long>>,std::less<std::pair<double,long>>,HighsNodeQueue::NodesetAllocator<std::pair<double,long>>>
                          *)((pNVar4->_M_t).
                             super___uniq_ptr_impl<std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>,_HighsNodeQueue::GlobalOperatorDelete>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>_*,_HighsNodeQueue::GlobalOperatorDelete>
                             .
                             super__Head_base<0UL,_std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>_*,_false>
                             ._M_head_impl + *(int *)(lVar3 + 8 + uVar6 * 2)),&local_38,&local_48);
      *(_Base_ptr *)
       (*(long *)&(this->nodes).
                  super__Vector_base<HighsNodeQueue::OpenNode,_std::allocator<HighsNodeQueue::OpenNode>_>
                  ._M_impl.super__Vector_impl_data._M_start[local_48].domchglinks.
                  super__Vector_base<std::_Rb_tree_const_iterator<std::pair<double,_long>_>,_std::allocator<std::_Rb_tree_const_iterator<std::pair<double,_long>_>_>_>
                  ._M_impl.super__Vector_impl_data + uVar6) = pVar7.first._M_node._M_node;
      node = local_48;
    }
  }
  return;
}

Assistant:

void HighsNodeQueue::link_domchgs(int64_t node) {
  assert(node != -1);
  HighsInt numchgs = nodes[node].domchgstack.size();
  nodes[node].domchglinks.resize(numchgs);

  for (HighsInt i = 0; i != numchgs; ++i) {
    double val = nodes[node].domchgstack[i].boundval;
    HighsInt col = nodes[node].domchgstack[i].column;
    switch (nodes[node].domchgstack[i].boundtype) {
      case HighsBoundType::kLower:
        nodes[node].domchglinks[i] =
            colLowerNodesPtr.get()[col].emplace(val, node).first;
        break;
      case HighsBoundType::kUpper:
        nodes[node].domchglinks[i] =
            colUpperNodesPtr.get()[col].emplace(val, node).first;
    }
  }
}